

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset.cpp
# Opt level: O0

pair<double,_double> runBenchmark(void)

{
  duration<double,_std::ratio<1L,_1L>_> local_48;
  rep local_40;
  double d2;
  rep local_30;
  double d1;
  LargeOffset *loa;
  SmallOffset *soa;
  
  loa = (LargeOffset *)operator_new__(1290000000);
  d1 = (double)operator_new__(1290000000);
  d2 = (double)benchmark<void(&)(SmallOffset*,int),SmallOffset*&,int_const&>
                         (benchmarkOffset<SmallOffset>,(SmallOffset **)&loa,&LENGTH);
  local_30 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                       ((duration<double,_std::ratio<1L,_1L>_> *)&d2);
  local_48 = benchmark<void(&)(LargeOffset*,int),LargeOffset*&,int_const&>
                       (benchmarkOffset<LargeOffset>,(LargeOffset **)&d1,&LENGTH);
  local_40 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_48);
  if (loa != (LargeOffset *)0x0) {
    operator_delete__(loa);
  }
  if (d1 != 0.0) {
    operator_delete__((void *)d1);
  }
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)&soa,&local_30,&local_40);
  return _soa;
}

Assistant:

std::pair<double, double> runBenchmark() {
  SmallOffset* soa = new SmallOffset[LENGTH];
  LargeOffset* loa = new LargeOffset[LENGTH];
  const double d1 = benchmark(benchmarkOffset<SmallOffset>, soa, LENGTH).count();
  const double d2 = benchmark(benchmarkOffset<LargeOffset>, loa, LENGTH).count();
  delete[] soa;
  delete[] loa;
  return {d1, d2};
}